

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

unordered_set<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
* __thiscall
wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
findLiveBlocks(unordered_set<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
               *__return_storage_ptr__,
              CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              *this)

{
  __node_base_ptr *__k;
  pointer ppBVar1;
  const_iterator cVar2;
  __hashtable *__h;
  pointer ppBVar3;
  undefined1 local_80 [8];
  unordered_set<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  BasicBlock *out;
  BasicBlock *curr;
  __node_gen_type __node_gen;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_80 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
  queue._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  queue._M_h._M_element_count._0_4_ = 0x3f800000;
  queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  queue._M_h._M_rehash_policy._4_4_ = 0;
  queue._M_h._M_rehash_policy._M_next_resize = 0;
  curr = (BasicBlock *)local_80;
  std::
  _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,false>>>>
            ((_Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_80,&this->entry);
  if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    __k = &queue._M_h._M_single_bucket;
    do {
      out = *(BasicBlock **)(queue._M_h._M_bucket_count + 8);
      std::
      _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase((_Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)local_80,(const_iterator)queue._M_h._M_bucket_count);
      curr = (BasicBlock *)__return_storage_ptr__;
      std::
      _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,false>>>>
                ((_Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)__return_storage_ptr__,&out,&curr);
      ppBVar1 = (out->out).
                super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar3 = (out->out).
                     super__Vector_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar1;
          ppBVar3 = ppBVar3 + 1) {
        queue._M_h._M_single_bucket = (__node_base_ptr)*ppBVar3;
        cVar2 = std::
                _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&__return_storage_ptr__->_M_h,(key_type *)__k);
        if (cVar2.
            super__Node_iterator_base<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
            ._M_cur == (__node_type *)0x0) {
          curr = (BasicBlock *)local_80;
          std::
          _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,false>>>>
                    ((_Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*,std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Identity,std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::hash<wasm::CFGWalker<wasm::CoalesceLocals,wasm::Visitor<wasm::CoalesceLocals,void>,wasm::Liveness>::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_80,__k,&curr);
        }
      }
    } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<BasicBlock*> findLiveBlocks() {
    std::unordered_set<BasicBlock*> alive;
    std::unordered_set<BasicBlock*> queue;
    queue.insert(entry);
    while (queue.size() > 0) {
      auto iter = queue.begin();
      auto* curr = *iter;
      queue.erase(iter);
      alive.insert(curr);
      for (auto* out : curr->out) {
        if (!alive.count(out)) {
          queue.insert(out);
        }
      }
    }
    return alive;
  }